

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

void __thiscall Fl_Text_Buffer::move_gap(Fl_Text_Buffer *this,int pos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = this->mGapStart;
  if (iVar1 < pos) {
    iVar3 = pos - iVar1;
    iVar2 = this->mGapEnd;
    iVar4 = iVar1;
  }
  else {
    iVar4 = (this->mGapEnd + pos) - iVar1;
    iVar3 = iVar1 - pos;
    iVar2 = pos;
  }
  memmove(this->mBuf + iVar4,this->mBuf + iVar2,(long)iVar3);
  this->mGapEnd = this->mGapEnd + (pos - this->mGapStart);
  this->mGapStart = pos;
  return;
}

Assistant:

void Fl_Text_Buffer::move_gap(int pos)
{
  int gapLen = mGapEnd - mGapStart;
  
  if (pos > mGapStart)
    memmove(&mBuf[mGapStart], &mBuf[mGapEnd], pos - mGapStart);
  else
    memmove(&mBuf[pos + gapLen], &mBuf[pos], mGapStart - pos);
  mGapEnd += pos - mGapStart;
  mGapStart += pos - mGapStart;
}